

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ImGuiColumns *columns;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *local_70;
  uint local_68;
  byte local_39;
  int local_38;
  int n;
  ImGuiWindowFlags flags;
  char *label_local;
  ImGuiWindow *window_local;
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
  }
  else {
    local_39 = 1;
    if ((window->Active & 1U) == 0) {
      local_39 = window->WasActive;
    }
    bVar1 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,(ulong)(local_39 & 1),window);
    if (bVar1) {
      uVar2 = window->Flags;
      NodeDrawList(window,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y);
      pcVar5 = "";
      if ((uVar2 & 0x1000000) != 0) {
        pcVar5 = "Child ";
      }
      pcVar4 = "";
      if ((uVar2 & 0x2000000) != 0) {
        pcVar4 = "Tooltip ";
      }
      pcVar7 = "";
      if ((uVar2 & 0x4000000) != 0) {
        pcVar7 = "Popup ";
      }
      pcVar8 = "";
      if ((uVar2 & 0x8000000) != 0) {
        pcVar8 = "Modal ";
      }
      pcVar11 = "";
      if ((uVar2 & 0x10000000) != 0) {
        pcVar11 = "ChildMenu ";
      }
      pcVar6 = "";
      if ((uVar2 & 0x100) != 0) {
        pcVar6 = "NoSavedSettings ";
      }
      pcVar10 = "";
      if ((uVar2 & 0x200) != 0) {
        pcVar10 = "NoMouseInputs";
      }
      pcVar9 = "";
      if ((uVar2 & 0x40000) != 0) {
        pcVar9 = "NoNavInputs";
      }
      pcVar3 = "";
      if ((uVar2 & 0x40) != 0) {
        pcVar3 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar2,pcVar5,pcVar4,pcVar7,pcVar8,
                 pcVar11,pcVar6,pcVar10,pcVar9,pcVar3);
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,(double)(window->Scroll).y,
                 (double)(window->ScrollMax).y);
      if (((window->Active & 1U) == 0) && ((window->WasActive & 1U) == 0)) {
        local_68 = 0xffffffff;
      }
      else {
        local_68 = (uint)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(window->Active & 1),(ulong)(window->WasActive & 1),
                 (ulong)(window->WriteAccessed & 1),(ulong)local_68);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(window->Appearing & 1),(ulong)(window->Hidden & 1),
                 (ulong)(uint)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)window->HiddenFramesCannotSkipItems,(ulong)(window->SkipItems & 1),
                 pcVar11,pcVar6,pcVar10,pcVar9,pcVar3);
      BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
                 (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        local_70 = "NULL";
      }
      else {
        local_70 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLastChildNavWindow: %s",local_70);
      bVar1 = ImRect::IsInverted(window->NavRectRel);
      if (bVar1) {
        BulletText("NavRectRel[0]: <None>");
      }
      else {
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)window->NavRectRel[0].Min.x,
                   (double)window->NavRectRel[0].Min.y,(double)window->NavRectRel[0].Max.x,
                   (double)window->NavRectRel[0].Max.y);
      }
      if (window->RootWindow != window) {
        NodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        NodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
      }
      if ((0 < (window->ColumnsStorage).Size) &&
         (bVar1 = TreeNode("Columns","Columns sets (%d)",(ulong)(uint)(window->ColumnsStorage).Size)
         , bVar1)) {
        for (local_38 = 0; local_38 < (window->ColumnsStorage).Size; local_38 = local_38 + 1) {
          columns = ImVector<ImGuiColumns>::operator[](&window->ColumnsStorage,local_38);
          NodeColumns(columns);
        }
        TreePop();
      }
      uVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::size_in_bytes(&(window->StateStorage).Data);
      BulletText("Storage: %d bytes",(ulong)uVar2);
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y);
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.size_in_bytes());
            ImGui::TreePop();
        }